

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void Js::FunctionBody::GetShortNameFromUrl(LPCWSTR pchUrl,LPWSTR pchShortName,size_t cchBuffer)

{
  long lVar1;
  short sVar2;
  char16_t *pcVar3;
  long lVar4;
  char16_t *pcVar5;
  long lVar6;
  
  pcVar3 = PAL_wcsrchr(pchUrl,L'/');
  if (pcVar3 == (char16_t *)0x0) {
    pcVar3 = PAL_wcsrchr(pchUrl,L'\\');
  }
  if (pchShortName != (LPWSTR)0x0 && cchBuffer != 0) {
    pcVar5 = pcVar3 + 1;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar5 = pchUrl;
    }
    if (pcVar5 != (char16_t *)0x0) {
      lVar6 = -1;
      lVar4 = 0;
      do {
        sVar2 = *(short *)((long)pcVar5 + lVar4);
        *(short *)((long)pchShortName + lVar4) = sVar2;
        if (sVar2 == 0) {
          if ((ulong)-lVar6 < cchBuffer) {
            memset((void *)((long)pchShortName + lVar4 + 2),0xfd,(cchBuffer * 2 - lVar4) - 2);
            return;
          }
          return;
        }
        lVar4 = lVar4 + 2;
        lVar1 = cchBuffer + lVar6;
        lVar6 = lVar6 + -1;
      } while (lVar1 != 0);
    }
    *pchShortName = L'\0';
    if (1 < cchBuffer) {
      memset(pchShortName + 1,0xfd,cchBuffer * 2 - 2);
    }
  }
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  return;
}

Assistant:

void FunctionBody::GetShortNameFromUrl(__in LPCWSTR pchUrl, _Out_writes_z_(cchBuffer) LPWSTR pchShortName, __in size_t cchBuffer)
    {
        LPCWSTR pchFile = wcsrchr(pchUrl, _u('/'));
        if (pchFile == nullptr)
        {
            pchFile = wcsrchr(pchUrl, _u('\\'));
        }

        LPCWSTR pchToCopy = pchUrl;

        if (pchFile != nullptr)
        {
            pchToCopy = pchFile + 1;
        }

        wcscpy_s(pchShortName, cchBuffer, pchToCopy);
    }